

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool tinyxml2::XMLUtil::ToBool(char *str,bool *value)

{
  bool bVar1;
  int local_24;
  bool *pbStack_20;
  int ival;
  bool *value_local;
  char *str_local;
  
  local_24 = 0;
  pbStack_20 = value;
  value_local = (bool *)str;
  bVar1 = ToInt(str,&local_24);
  if (bVar1) {
    *pbStack_20 = (bool)(-(local_24 != 0) & 1);
    str_local._7_1_ = true;
  }
  else {
    bVar1 = StringEqual(value_local,"true",0x7fffffff);
    if (bVar1) {
      *pbStack_20 = true;
      str_local._7_1_ = true;
    }
    else {
      bVar1 = StringEqual(value_local,"false",0x7fffffff);
      if (bVar1) {
        *pbStack_20 = false;
        str_local._7_1_ = true;
      }
      else {
        str_local._7_1_ = false;
      }
    }
  }
  return str_local._7_1_;
}

Assistant:

bool XMLUtil::ToBool(const char* str, bool* value)
{
    int ival = 0;
    if (ToInt(str, &ival)) {
        *value = (ival == 0) ? false : true;
        return true;
    }
    if (StringEqual(str, "true")) {
        *value = true;
        return true;
    } else if (StringEqual(str, "false")) {
        *value = false;
        return true;
    }
    return false;
}